

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall CommandBlock::~CommandBlock(CommandBlock *this)

{
  ~CommandBlock(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CommandBlock()
    {
        delete process;
    }